

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O2

void __thiscall cali::Caliper::async_event(Caliper *this,SnapshotView info)

{
  siglock *psVar1;
  ThreadData *pTVar2;
  pointer pCVar3;
  Channel *channel;
  pointer pCVar4;
  element_type *local_50;
  Caliper *local_48;
  SnapshotView local_40;
  
  local_40.m_len = info.m_len;
  local_40.m_data = info.m_data;
  pTVar2 = this->sT;
  psVar1 = &pTVar2->lock;
  psVar1->m_lock = psVar1->m_lock + 1;
  pCVar3 = (this->sG->active_channels).
           super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pCVar4 = (this->sG->active_channels).
                super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
                super__Vector_impl_data._M_start; pCVar4 != pCVar3; pCVar4 = pCVar4 + 1) {
    local_50 = (pCVar4->mP).super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_48 = this;
    util::callback<void(cali::Caliper*,cali::ChannelBody*,cali::SnapshotView)>::operator()
              ((callback<void(cali::Caliper*,cali::ChannelBody*,cali::SnapshotView)> *)
               &(local_50->events).async_event,&local_48,&local_50,&local_40);
  }
  psVar1 = &pTVar2->lock;
  psVar1->m_lock = psVar1->m_lock + -1;
  return;
}

Assistant:

void Caliper::async_event(SnapshotView info)
{
    std::lock_guard<::siglock> g(sT->lock);

    for (auto& channel : sG->active_channels)
        channel.mP->events.async_event(this, channel.body(), info);
}